

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

int lua_checkstack(lua_State *L,int size)

{
  int iVar1;
  int avail;
  int size_local;
  lua_State *L_local;
  
  if ((size < 0x1f41) && (((long)L->top - (long)L->base >> 3) + (long)size < 0x1f41)) {
    if (((size < 1) ||
        (iVar1 = (int)((long)((L->maxstack).ptr64 - (long)L->top) >> 3), size <= iVar1)) ||
       (iVar1 = lj_state_cpgrowstack(L,size - iVar1), iVar1 == 0)) {
      L_local._4_4_ = 1;
    }
    else {
      L->top = L->top + -1;
      L_local._4_4_ = 0;
    }
  }
  else {
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_checkstack(lua_State *L, int size)
{
  if (size > LUAI_MAXCSTACK || (L->top - L->base + size) > LUAI_MAXCSTACK) {
    return 0;  /* Stack overflow. */
  } else if (size > 0) {
    int avail = (int)(mref(L->maxstack, TValue) - L->top);
    if (size > avail &&
	lj_state_cpgrowstack(L, (MSize)(size - avail)) != LUA_OK) {
      L->top--;
      return 0;  /* Out of memory. */
    }
  }
  return 1;
}